

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsPort.cpp
# Opt level: O0

void __thiscall
AmsPort::AddNotification(AmsPort *this,AmsAddr ams,uint32_t hNotify,SharedDispatcher *dispatcher)

{
  pair<const_AmsAddr,_const_unsigned_int> local_3c;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  SharedDispatcher *dispatcher_local;
  AmsPort *pAStack_18;
  uint32_t hNotify_local;
  AmsPort *this_local;
  AmsAddr ams_local;
  
  lock._M_device = (mutex_type *)dispatcher;
  dispatcher_local._4_4_ = hNotify;
  pAStack_18 = this;
  this_local = (AmsPort *)ams;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mutex);
  std::pair<const_AmsAddr,_const_unsigned_int>::pair<const_AmsAddr,_const_unsigned_int,_true>
            (&local_3c,(AmsAddr *)&this_local,(uint *)((long)&dispatcher_local + 4));
  std::
  map<std::pair<AmsAddr_const,unsigned_int_const>,std::shared_ptr<NotificationDispatcher>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
  ::emplace<std::pair<AmsAddr_const,unsigned_int_const>,std::shared_ptr<NotificationDispatcher>&>
            ((map<std::pair<AmsAddr_const,unsigned_int_const>,std::shared_ptr<NotificationDispatcher>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
              *)&this->dispatcherList,&local_3c,dispatcher);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void AmsPort::AddNotification(const AmsAddr ams, const uint32_t hNotify, SharedDispatcher dispatcher)
{
    std::lock_guard<std::mutex> lock(mutex);
    dispatcherList.emplace(NotifyUUID {ams, hNotify}, dispatcher);
}